

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Bool tt_face_get_colorline_stops
                  (TT_Face face,FT_ColorStop *color_stop,FT_ColorStopIterator *iterator)

{
  Colr *colr_00;
  FT_Byte *pFVar1;
  FT_Bool FVar2;
  int local_54;
  short local_50;
  FT_Int item_deltas [2];
  FT_UInt entry_size;
  FT_Byte *last_entry_p;
  FT_ULong var_index_base;
  FT_Byte *p;
  Colr *colr;
  FT_ColorStopIterator *iterator_local;
  FT_ColorStop *color_stop_local;
  TT_Face face_local;
  
  colr_00 = (Colr *)face->colr;
  item_deltas[0] = 6;
  if (((colr_00 == (Colr *)0x0) || (colr_00->table == (void *)0x0)) ||
     (iterator == (FT_ColorStopIterator *)0x0)) {
    face_local._7_1_ = '\0';
  }
  else if (iterator->current_color_stop < iterator->num_color_stops) {
    if (iterator->read_variable != '\0') {
      item_deltas[0] = 10;
    }
    register0x00000000 =
         iterator->p +
         ((iterator->num_color_stops - 1) - iterator->current_color_stop) * item_deltas[0];
    if ((iterator->p < colr_00->paints_start_v1) ||
       ((FT_Byte *)((long)colr_00->table + (colr_00->table_size - (ulong)(uint)item_deltas[0])) <
        register0x00000000)) {
      face_local._7_1_ = '\0';
    }
    else {
      pFVar1 = iterator->p;
      color_stop->stop_offset = (long)CONCAT11(*pFVar1,pFVar1[1]) << 2;
      (color_stop->color).palette_index = CONCAT11(pFVar1[2],pFVar1[3]);
      var_index_base = (FT_ULong)(pFVar1 + 6);
      (color_stop->color).alpha = CONCAT11(pFVar1[4],pFVar1[5]);
      if (iterator->read_variable != '\0') {
        var_index_base = (FT_ULong)(pFVar1 + 10);
        FVar2 = get_deltas_for_var_index_base
                          (face,colr_00,
                           (ulong)((uint)pFVar1[6] << 0x18 | (uint)pFVar1[7] << 0x10 |
                                   (uint)pFVar1[8] << 8 | (uint)pFVar1[9]),2,&local_54);
        if (FVar2 == '\0') {
          return '\0';
        }
        color_stop->stop_offset = (long)local_54 * 4 + color_stop->stop_offset;
        (color_stop->color).alpha = (color_stop->color).alpha + local_50;
      }
      iterator->p = (FT_Byte *)var_index_base;
      iterator->current_color_stop = iterator->current_color_stop + 1;
      face_local._7_1_ = '\x01';
    }
  }
  else {
    face_local._7_1_ = '\0';
  }
  return face_local._7_1_;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_colorline_stops( TT_Face                face,
                               FT_ColorStop*          color_stop,
                               FT_ColorStopIterator  *iterator )
  {
    Colr*  colr = (Colr*)face->colr;

    FT_Byte*  p;
    FT_ULong  var_index_base;
    FT_Byte*  last_entry_p = NULL;
    FT_UInt   entry_size   = COLOR_STOP_SIZE;


    if ( !colr || !colr->table || !iterator )
      return 0;

    if ( iterator->current_color_stop >= iterator->num_color_stops )
      return 0;

    if ( iterator->read_variable )
      entry_size += VAR_IDX_BASE_SIZE;

    /* Calculate the start pointer for the last to-be-read (Var)ColorStop */
    /* and check whether we can read a full (Var)ColorStop at that        */
    /* position by comparing it to the position that is the size of one   */
    /* (Var)ColorStop before the end of the 'COLR' table.                 */
    last_entry_p =
      iterator->p + ( iterator->num_color_stops - 1 -
                      iterator->current_color_stop ) * entry_size;
    if ( iterator->p < colr->paints_start_v1          ||
         last_entry_p > (FT_Byte*)colr->table +
                        colr->table_size - entry_size )
      return 0;

    /* Iterator points at first `ColorStop` of `ColorLine`. */
    p = iterator->p;

    color_stop->stop_offset = F2DOT14_TO_FIXED( FT_NEXT_SHORT( p ) );

    color_stop->color.palette_index = FT_NEXT_USHORT( p );

    color_stop->color.alpha = FT_NEXT_SHORT( p );

    if ( iterator->read_variable )
    {
      /* Pointer p needs to be advanced independently of whether we intend */
      /* to take variable deltas into account or not.  Otherwise iteration */
      /* would fail due to wrong offsets.                                  */
      var_index_base = FT_NEXT_ULONG( p );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      {
        FT_Int  item_deltas[2];


        if ( !get_deltas_for_var_index_base( face, colr,
                                             var_index_base,
                                             2,
                                             item_deltas ) )
          return 0;

        color_stop->stop_offset += F2DOT14_TO_FIXED( item_deltas[0] );
        color_stop->color.alpha += item_deltas[1];
      }
#else
      FT_UNUSED( var_index_base );
#endif
    }

    iterator->p = p;
    iterator->current_color_stop++;

    return 1;
  }